

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_local.c
# Opt level: O3

int localLog(mpt_logger *log,char *from,int type,char *fmt,__va_list_tag *arg)

{
  int iVar1;
  undefined8 *puVar2;
  
  if (((ulong)log[4]._vptr & 0x10) == 0) {
    iVar1 = mpt_logfile_log(log + 3,from,type,fmt,arg);
    return iVar1;
  }
  puVar2 = (undefined8 *)mpt_log_default();
  if (puVar2 != (undefined8 *)0x0) {
    iVar1 = (**(code **)*puVar2)(puVar2,from,type,fmt,arg,*(code **)*puVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

static int localLog(MPT_INTERFACE(logger) *log, const char *from, int type, const char *fmt, va_list arg)
{
	MPT_STRUCT(local_output) *lo = MPT_baseaddr(local_output, log, _log);
	
	if (!(lo->hist.info.state & MPT_OUTFLAG(Active))) {
		return mpt_logfile_log(&lo->hist.info, from, type, fmt, arg);
	}
	if ((log = mpt_log_default())) {
		return log->_vptr->log(log, from, type, fmt, arg);
	}
	return 0;
}